

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O2

void OpalOperator_ComputeRates(OpalOperator *self)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint uVar5;
  uint16_t *puVar6;
  uint uVar7;
  
  uVar2 = self->Chan->KeyScaleNumber >> (self->KeyScaleRate == 0) * '\x02';
  uVar7 = (uint)(uVar2 >> 2);
  uVar5 = uVar7 + self->AttackRate;
  uVar1 = (uint16_t)(1 << ((char)uVar5 - 0xcU & 0x1f));
  if (uVar5 < 0xc) {
    uVar1 = 1;
  }
  uVar3 = 0xc - (short)uVar5;
  if (0xc < uVar5) {
    uVar3 = 0;
  }
  puVar6 = (uint16_t *)((long)RateTables[0] + (ulong)((uVar2 & 3) << 4));
  self->AttackShift = uVar3;
  self->AttackMask = ~(ushort)(-1 << ((byte)uVar3 & 0x1f));
  self->AttackAdd = uVar1;
  self->AttackTab = puVar6;
  if (self->AttackRate == 0xf) {
    self->AttackAdd = 0xfff;
  }
  uVar5 = self->ReleaseRate + uVar7;
  uVar1 = (uint16_t)(1 << ((char)uVar5 - 0xcU & 0x1f));
  if (uVar5 < 0xc) {
    uVar1 = 1;
  }
  uVar7 = self->DecayRate + uVar7;
  uVar3 = (uint16_t)(1 << ((char)uVar7 - 0xcU & 0x1f));
  if (uVar7 < 0xc) {
    uVar3 = 1;
  }
  uVar4 = 0xc - (short)uVar7;
  if (0xc < uVar7) {
    uVar4 = 0;
  }
  self->DecayShift = uVar4;
  self->DecayMask = ~(ushort)(-1 << ((byte)uVar4 & 0x1f));
  self->DecayAdd = uVar3;
  self->DecayTab = puVar6;
  uVar3 = 0xc - (short)uVar5;
  if (0xc < uVar5) {
    uVar3 = 0;
  }
  self->ReleaseShift = uVar3;
  self->ReleaseMask = ~(ushort)(-1 << ((byte)uVar3 & 0x1f));
  self->ReleaseAdd = uVar1;
  self->ReleaseTab = puVar6;
  return;
}

Assistant:

static void OpalOperator_ComputeRates(OpalOperator *self)
{
    int combined_rate = self->AttackRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    int rate_high = combined_rate >> 2;
    int rate_low = combined_rate & 3;

    self->AttackShift = rate_high < 12 ? 12 - rate_high : 0;
    self->AttackMask = (1 << self->AttackShift) - 1;
    self->AttackAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->AttackTab = RateTables[rate_low];

    /* Attack rate of 15 is always instant */
    if(self->AttackRate == 15)
        self->AttackAdd = 0xFFF;

    combined_rate = self->DecayRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    rate_high = combined_rate >> 2;
    rate_low = combined_rate & 3;

    self->DecayShift = rate_high < 12 ? 12 - rate_high : 0;
    self->DecayMask = (1 << self->DecayShift) - 1;
    self->DecayAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->DecayTab = RateTables[rate_low];

    combined_rate = self->ReleaseRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    rate_high = combined_rate >> 2;
    rate_low = combined_rate & 3;

    self->ReleaseShift = rate_high < 12 ? 12 - rate_high : 0;
    self->ReleaseMask = (1 << self->ReleaseShift) - 1;
    self->ReleaseAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->ReleaseTab = RateTables[rate_low];
}